

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O0

bool google::protobuf::internal::
     AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>>
               (RepeatedPtrField<google::protobuf::DescriptorProto> *t)

{
  bool bVar1;
  int index;
  RepeatedPtrField<google::protobuf::DescriptorProto> *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  
  index = RepeatedPtrField<google::protobuf::DescriptorProto>::size
                    ((RepeatedPtrField<google::protobuf::DescriptorProto> *)0x53bf53);
  do {
    index = index + -1;
    if (index < 0) {
      return true;
    }
    RepeatedPtrField<google::protobuf::DescriptorProto>::Get(in_RDI,index);
    bVar1 = DescriptorProto::IsInitialized
                      ((DescriptorProto *)CONCAT44(index,in_stack_ffffffffffffffe8));
  } while (bVar1);
  return false;
}

Assistant:

bool AllAreInitialized(const Type& t) {
  for (int i = t.size(); --i >= 0;) {
    if (!t.Get(i).IsInitialized()) return false;
  }
  return true;
}